

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_fixture.c
# Opt level: O1

REF_STATUS ref_fixture_tri_grid(REF_GRID_conflict *ref_grid_ptr,REF_MPI ref_mpi)

{
  REF_GRID_conflict pRVar1;
  REF_NODE ref_node;
  REF_DBL *pRVar2;
  REF_DBL *pRVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  REF_INT RVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  REF_INT cell;
  REF_INT local [27];
  REF_INT local_ac;
  int local_a8;
  int local_a4;
  REF_INT local_a0 [28];
  
  uVar4 = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (uVar4 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x169
           ,"ref_fixture_tri_grid",(ulong)uVar4,"create");
    return uVar4;
  }
  pRVar1 = *ref_grid_ptr;
  ref_node = pRVar1->node;
  pRVar1->twod = 1;
  iVar5 = ref_mpi->n;
  iVar6 = ref_mpi->id;
  iVar7 = 0;
  iVar9 = (int)(2 / (long)iVar5);
  iVar11 = iVar9 * iVar5;
  if (2 < iVar11) {
    iVar7 = ((((iVar5 + 2) / iVar5) * (iVar11 + -3)) / iVar9 - iVar11) + 3;
  }
  if (iVar6 != iVar7) {
    iVar5 = (iVar5 + 2) / iVar5;
    iVar7 = 0;
    if (iVar5 + 1U < 3) {
      iVar7 = iVar5;
    }
    iVar11 = 3 - iVar11;
    if (iVar11 <= iVar7) {
      iVar7 = (1 - iVar5 * iVar11) / iVar9 + iVar11;
    }
    if (iVar6 != iVar7) {
      iVar7 = (int)(2 / (long)iVar5);
      if (iVar11 <= iVar7) {
        iVar7 = (2 - iVar5 * iVar11) / iVar9 + iVar11;
      }
      if (iVar6 != iVar7) goto LAB_001382d6;
    }
  }
  uVar4 = ref_node_add(ref_node,0,&local_a8);
  if (uVar4 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x179
           ,"ref_fixture_tri_grid",(ulong)uVar4,"add node");
    return uVar4;
  }
  pRVar2 = ref_node->real;
  lVar12 = (long)local_a8;
  pRVar3 = pRVar2 + lVar12 * 0xf;
  *pRVar3 = 0.0;
  pRVar3[1] = 0.0;
  pRVar2[lVar12 * 0xf + 2] = 0.0;
  lVar10 = -1;
  if (((-1 < lVar12) && (local_a8 < ref_node->max)) && (-1 < ref_node->global[lVar12])) {
    lVar10 = ref_node->global[lVar12];
  }
  iVar5 = ref_mpi->n;
  iVar6 = (iVar5 + 2) / iVar5;
  if (lVar10 / (long)iVar6 < (long)(ulong)((int)(2 % (long)iVar5) + 1)) {
    lVar10 = -1;
    if ((-1 < local_a8) && (local_a8 < ref_node->max)) {
      lVar10 = -1;
      if (-1 < ref_node->global[lVar12]) {
        lVar10 = ref_node->global[lVar12];
      }
    }
    RVar8 = (REF_INT)(lVar10 / (long)iVar6);
  }
  else {
    lVar10 = -1;
    if ((-1 < local_a8) && (local_a8 < ref_node->max)) {
      lVar10 = -1;
      if (-1 < ref_node->global[lVar12]) {
        lVar10 = ref_node->global[lVar12];
      }
    }
    iVar9 = (int)(2 / (long)iVar5);
    iVar5 = 3 - iVar5 * iVar9;
    RVar8 = iVar5 + (int)((lVar10 - iVar6 * iVar5) / (long)iVar9);
  }
  ref_node->part[lVar12] = RVar8;
  uVar4 = ref_node_add(ref_node,1,&local_a4);
  if (uVar4 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x17a
           ,"ref_fixture_tri_grid",(ulong)uVar4,"add node");
    return uVar4;
  }
  pRVar3 = ref_node->real;
  lVar12 = (long)local_a4;
  pRVar3[lVar12 * 0xf] = 0.0;
  pRVar3[lVar12 * 0xf + 1] = 1.0;
  pRVar3[lVar12 * 0xf + 2] = 0.0;
  lVar10 = -1;
  if (((-1 < lVar12) && (local_a4 < ref_node->max)) && (-1 < ref_node->global[lVar12])) {
    lVar10 = ref_node->global[lVar12];
  }
  iVar5 = ref_mpi->n;
  iVar6 = (iVar5 + 2) / iVar5;
  if (lVar10 / (long)iVar6 < (long)(ulong)((int)(2 % (long)iVar5) + 1)) {
    lVar10 = -1;
    if ((-1 < local_a4) && (local_a4 < ref_node->max)) {
      lVar10 = -1;
      if (-1 < ref_node->global[lVar12]) {
        lVar10 = ref_node->global[lVar12];
      }
    }
    RVar8 = (REF_INT)(lVar10 / (long)iVar6);
  }
  else {
    lVar10 = -1;
    if ((-1 < local_a4) && (local_a4 < ref_node->max)) {
      lVar10 = -1;
      if (-1 < ref_node->global[lVar12]) {
        lVar10 = ref_node->global[lVar12];
      }
    }
    iVar9 = (int)(2 / (long)iVar5);
    iVar5 = 3 - iVar5 * iVar9;
    RVar8 = iVar5 + (int)((lVar10 - iVar6 * iVar5) / (long)iVar9);
  }
  ref_node->part[lVar12] = RVar8;
  uVar4 = ref_node_add(ref_node,2,local_a0);
  if (uVar4 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x17b
           ,"ref_fixture_tri_grid",(ulong)uVar4,"add node");
    return uVar4;
  }
  pRVar3 = ref_node->real;
  lVar12 = (long)local_a0[0];
  pRVar3[lVar12 * 0xf] = 1.0;
  pRVar3 = pRVar3 + lVar12 * 0xf + 1;
  *pRVar3 = 0.0;
  pRVar3[1] = 0.0;
  lVar10 = -1;
  if (((-1 < lVar12) && (local_a0[0] < ref_node->max)) && (-1 < ref_node->global[lVar12])) {
    lVar10 = ref_node->global[lVar12];
  }
  iVar5 = ref_mpi->n;
  iVar6 = (iVar5 + 2) / iVar5;
  if (lVar10 / (long)iVar6 < (long)(ulong)((int)(2 % (long)iVar5) + 1)) {
    lVar10 = -1;
    if ((-1 < local_a0[0]) && (local_a0[0] < ref_node->max)) {
      lVar10 = -1;
      if (-1 < ref_node->global[lVar12]) {
        lVar10 = ref_node->global[lVar12];
      }
    }
    RVar8 = (REF_INT)(lVar10 / (long)iVar6);
  }
  else {
    lVar10 = -1;
    if ((-1 < local_a0[0]) && (local_a0[0] < ref_node->max)) {
      lVar10 = -1;
      if (-1 < ref_node->global[lVar12]) {
        lVar10 = ref_node->global[lVar12];
      }
    }
    iVar9 = (int)(2 / (long)iVar5);
    iVar5 = 3 - iVar5 * iVar9;
    RVar8 = iVar5 + (int)((lVar10 - iVar6 * iVar5) / (long)iVar9);
  }
  ref_node->part[lVar12] = RVar8;
  local_a0[1] = 0x65;
  uVar4 = ref_cell_add(pRVar1->cell[3],&local_a8,&local_ac);
  if (uVar4 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x17d
           ,"ref_fixture_tri_grid",(ulong)uVar4,"add tri");
    return uVar4;
  }
LAB_001382d6:
  uVar4 = ref_node_initialize_n_global(ref_node,3);
  if (uVar4 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x180
           ,"ref_fixture_tri_grid",(ulong)uVar4,"init glob");
    return uVar4;
  }
  iVar5 = ref_mpi->n;
  iVar9 = 0;
  iVar6 = (int)(2 / (long)iVar5);
  iVar7 = iVar6 * iVar5;
  if (2 < iVar7) {
    iVar9 = ((((iVar5 + 2) / iVar5) * (iVar7 + -3)) / iVar6 - iVar7) + 3;
  }
  if (ref_mpi->id != iVar9) {
    iVar5 = (iVar5 + 2) / iVar5;
    iVar9 = 0;
    if (iVar5 + 1U < 3) {
      iVar9 = iVar5;
    }
    iVar7 = 3 - iVar7;
    if (iVar7 <= iVar9) {
      iVar9 = (1 - iVar5 * iVar7) / iVar6 + iVar7;
    }
    if (ref_mpi->id != iVar9) {
      return 0;
    }
  }
  uVar4 = ref_node_local(ref_node,0,&local_a8);
  if (uVar4 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x189
           ,"ref_fixture_tri_grid",(ulong)uVar4,"loc");
    return uVar4;
  }
  uVar4 = ref_node_local(ref_node,1,&local_a4);
  if (uVar4 == 0) {
    local_a0[0] = 10;
    uVar4 = ref_cell_add(pRVar1->cell[0],&local_a8,&local_ac);
    if (uVar4 == 0) {
      return 0;
    }
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x18c
           ,"ref_fixture_tri_grid",(ulong)uVar4,"add edg");
    return uVar4;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x18a,
         "ref_fixture_tri_grid",(ulong)uVar4,"loc");
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_fixture_tri_grid(REF_GRID *ref_grid_ptr,
                                        REF_MPI ref_mpi) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_INT global[REF_CELL_MAX_SIZE_PER];
  REF_INT local[REF_CELL_MAX_SIZE_PER];
  REF_INT cell;
  REF_INT nnodesg = 3;

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create");
  ref_grid = *ref_grid_ptr;
  ref_node = ref_grid_node(ref_grid);

  ref_grid_twod(ref_grid) = REF_TRUE;

  global[0] = 0;
  global[1] = 1;
  global[2] = 2;
  global[3] = 101;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2])) {
    add_that_node(0, 0.0, 0.0, 0.0);
    add_that_node(1, 0.0, 1.0, 0.0);
    add_that_node(2, 1.0, 0.0, 0.0);
    local[3] = global[3];
    RSS(ref_cell_add(ref_grid_tri(ref_grid), local, &cell), "add tri");
  }

  RSS(ref_node_initialize_n_global(ref_node, nnodesg), "init glob");

  global[0] = 0;
  global[1] = 1;
  global[2] = 10;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1])) {
    RSS(ref_node_local(ref_node, global[0], &(local[0])), "loc");
    RSS(ref_node_local(ref_node, global[1], &(local[1])), "loc");
    local[2] = global[2];
    RSS(ref_cell_add(ref_grid_edg(ref_grid), local, &cell), "add edg");
  }

  return REF_SUCCESS;
}